

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void ssl_calc_verify_tls(mbedtls_ssl_context *ssl,uchar *hash)

{
  mbedtls_md5_context md5;
  mbedtls_sha1_context sha1;
  mbedtls_md5_context local_dc;
  mbedtls_sha1_context local_84;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3f0,"=> calc verify tls");
  mbedtls_md5_init(&local_dc);
  mbedtls_sha1_init(&local_84);
  mbedtls_md5_clone(&local_dc,&ssl->handshake->fin_md5);
  mbedtls_sha1_clone(&local_84,&ssl->handshake->fin_sha1);
  mbedtls_md5_finish(&local_dc,hash);
  mbedtls_sha1_finish(&local_84,hash + 0x10);
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3fb,"calculated verify result",hash,0x24);
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_tls.c"
             ,0x3fc,"<= calc verify");
  mbedtls_md5_free(&local_dc);
  mbedtls_sha1_free(&local_84);
  return;
}

Assistant:

void ssl_calc_verify_tls( mbedtls_ssl_context *ssl, unsigned char hash[36] )
{
    mbedtls_md5_context md5;
    mbedtls_sha1_context sha1;

    MBEDTLS_SSL_DEBUG_MSG( 2, ( "=> calc verify tls" ) );

    mbedtls_md5_init( &md5 );
    mbedtls_sha1_init( &sha1 );

    mbedtls_md5_clone( &md5, &ssl->handshake->fin_md5 );
    mbedtls_sha1_clone( &sha1, &ssl->handshake->fin_sha1 );

     mbedtls_md5_finish( &md5,  hash );
    mbedtls_sha1_finish( &sha1, hash + 16 );

    MBEDTLS_SSL_DEBUG_BUF( 3, "calculated verify result", hash, 36 );
    MBEDTLS_SSL_DEBUG_MSG( 2, ( "<= calc verify" ) );

    mbedtls_md5_free(  &md5  );
    mbedtls_sha1_free( &sha1 );

    return;
}